

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void set_advisor_read_lock(char *filename)

{
  int iVar1;
  FILE *__stream;
  uint *puVar2;
  char *pcVar3;
  uint __errnum;
  char *msg;
  bool bVar4;
  
  __stream = fopen64(filename,"wb");
  __errnum = 0;
  bVar4 = __stream == (FILE *)0x0;
  if (bVar4) {
    puVar2 = (uint *)__errno_location();
    __errnum = *puVar2;
    while (__errnum == 4) {
      __stream = fopen64(filename,"wb");
      bVar4 = __stream == (FILE *)0x0;
      if (!bVar4) {
        __errnum = 4;
        break;
      }
      __errnum = *puVar2;
    }
  }
  if (bVar4) {
    pcVar3 = strerror(__errnum);
    msg = "Error creating lock file %s error: %d %s";
  }
  else {
    iVar1 = fclose(__stream);
    bVar4 = iVar1 == 0;
    if (!bVar4) {
      puVar2 = (uint *)__errno_location();
      __errnum = *puVar2;
      while (__errnum == 4) {
        iVar1 = fclose(__stream);
        bVar4 = iVar1 == 0;
        if (bVar4) {
          __errnum = 4;
          break;
        }
        __errnum = *puVar2;
      }
    }
    if (bVar4) {
      return;
    }
    pcVar3 = strerror(__errnum);
    msg = "Error closing lock file %s error: %d %s";
  }
  logmsg(msg,filename,(ulong)__errnum,pcVar3);
  return;
}

Assistant:

void set_advisor_read_lock(const char *filename)
{
  FILE *lockfile;
  int error = 0;
  int res;

  do {
    lockfile = fopen(filename, "wb");
  } while((lockfile == NULL) && ((error = errno) == EINTR));
  if(lockfile == NULL) {
    logmsg("Error creating lock file %s error: %d %s",
           filename, error, strerror(error));
    return;
  }

  do {
    res = fclose(lockfile);
  } while(res && ((error = errno) == EINTR));
  if(res)
    logmsg("Error closing lock file %s error: %d %s",
           filename, error, strerror(error));
}